

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::SetIndexAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<3UL> *pJVar2;
  Var instance;
  RecyclableObject *pRVar3;
  Var aValue;
  undefined1 *aValue_00;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<3ul>,(TTD::NSLogEvents::EventKind)60>
                     (evt);
  instance = InflateVarInReplay(executeContext,pJVar2->VarArray[0]);
  if (instance != (Var)0x0) {
    BVar1 = Js::JavascriptOperators::IsObject(instance);
    if (BVar1 != 0) {
      pRVar3 = Js::VarTo<Js::RecyclableObject>(instance);
      if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        instance = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
      }
      aValue = InflateVarInReplay(executeContext,pJVar2->VarArray[1]);
      if (aValue != (Var)0x0) {
        if ((ulong)aValue >> 0x30 == 0) {
          pRVar3 = Js::VarTo<Js::RecyclableObject>(aValue);
          if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr != scriptContext) {
            aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
          }
        }
        aValue_00 = (undefined1 *)InflateVarInReplay(executeContext,pJVar2->VarArray[2]);
        if (aValue_00 != (undefined1 *)0x0) {
          if (aValue_00 < &DAT_1000000000000) {
            pRVar3 = Js::VarTo<Js::RecyclableObject>(aValue_00);
            if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              aValue_00 = (undefined1 *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
            }
          }
          Js::JavascriptOperators::OP_SetElementI
                    (instance,aValue,aValue_00,scriptContext,PropertyOperation_None);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void SetIndexAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTTrippleVarArgumentAction* action = GetInlineEventDataAs<JsRTTrippleVarArgumentAction, EventKind::SetIndexActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var index = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(index, ctx);
            Js::Var value = InflateVarInReplay(executeContext, GetVarItem_2(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(value, ctx);

            Js::JavascriptOperators::OP_SetElementI(var, index, value, ctx);
        }